

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_enable_load_extension(sqlite3 *db,int onoff)

{
  int onoff_local;
  sqlite3 *db_local;
  
  sqlite3_mutex_enter(db->mutex);
  if (onoff == 0) {
    db->flags = db->flags & 0xffdfffff;
  }
  else {
    db->flags = db->flags | 0x200000;
  }
  sqlite3_mutex_leave(db->mutex);
  return 0;
}

Assistant:

SQLITE_API int sqlite3_enable_load_extension(sqlite3 *db, int onoff){
  sqlite3_mutex_enter(db->mutex);
  if( onoff ){
    db->flags |= SQLITE_LoadExtension;
  }else{
    db->flags &= ~SQLITE_LoadExtension;
  }
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}